

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::createAffixMatchers
          (AffixMatcherWarehouse *this,AffixPatternProvider *patternInfo,
          MutableMatcherCollection *output,IgnorablesMatcher *ignorables,parse_flags_t parseFlags,
          UErrorCode *status)

{
  bool bVar1;
  int8_t iVar2;
  long lVar3;
  AffixPatternMatcher *local_218;
  AffixPatternMatcher *local_210;
  int local_1fc;
  undefined1 local_1f8 [4];
  int32_t i_1;
  AffixMatcher temp;
  int32_t i;
  bool madeChanges;
  AffixMatcher local_1b0;
  AffixMatcher local_190;
  uint local_16c;
  AffixPatternMatcher *pAStack_168;
  int flags;
  AffixPatternMatcher *suffix;
  bool local_109;
  AffixPatternMatcher *pAStack_108;
  bool hasSuffix;
  AffixPatternMatcher *prefix;
  bool local_9a;
  char local_99;
  bool hasPrefix;
  AffixPatternMatcher *pAStack_98;
  int8_t signum;
  AffixPatternMatcher *posSuffix;
  AffixPatternMatcher *posPrefix;
  int32_t numAffixPatternMatchers;
  int32_t numAffixMatchers;
  UNumberSignDisplay signDisplay;
  bool includeUnpaired;
  UnicodeString sb;
  UErrorCode *status_local;
  parse_flags_t parseFlags_local;
  IgnorablesMatcher *ignorables_local;
  MutableMatcherCollection *output_local;
  AffixPatternProvider *patternInfo_local;
  AffixMatcherWarehouse *this_local;
  
  sb.fUnion._48_8_ = status;
  bVar1 = isInteresting(patternInfo,ignorables,parseFlags,status);
  if (bVar1) {
    UnicodeString::UnicodeString((UnicodeString *)&signDisplay);
    numAffixMatchers._3_1_ = (parseFlags & 0x80U) != 0;
    numAffixPatternMatchers = (int32_t)((parseFlags & 0x400U) != 0);
    posPrefix._4_4_ = 0;
    posPrefix._0_4_ = 0;
    posSuffix = (AffixPatternMatcher *)0x0;
    pAStack_98 = (AffixPatternMatcher *)0x0;
    for (local_99 = '\x01'; -2 < local_99; local_99 = local_99 + -1) {
      local_9a = false;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (patternInfo,true,local_99,numAffixPatternMatchers,OTHER,false,
                 (UnicodeString *)&signDisplay);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)&prefix,(UnicodeString *)&signDisplay,this->fTokenWarehouse,
                 parseFlags,&local_9a,(UErrorCode *)sb.fUnion._48_8_);
      AffixPatternMatcher::operator=
                (this->fAffixPatternMatchers + (int)posPrefix,(AffixPatternMatcher *)&prefix);
      AffixPatternMatcher::~AffixPatternMatcher((AffixPatternMatcher *)&prefix);
      if ((local_9a & 1U) == 0) {
        local_210 = (AffixPatternMatcher *)0x0;
      }
      else {
        local_210 = this->fAffixPatternMatchers + (int)posPrefix;
        posPrefix._0_4_ = (int)posPrefix + 1;
      }
      pAStack_108 = local_210;
      local_109 = false;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (patternInfo,false,local_99,numAffixPatternMatchers,OTHER,false,
                 (UnicodeString *)&signDisplay);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)&suffix,(UnicodeString *)&signDisplay,this->fTokenWarehouse,
                 parseFlags,&local_109,(UErrorCode *)sb.fUnion._48_8_);
      AffixPatternMatcher::operator=
                (this->fAffixPatternMatchers + (int)posPrefix,(AffixPatternMatcher *)&suffix);
      AffixPatternMatcher::~AffixPatternMatcher((AffixPatternMatcher *)&suffix);
      if ((local_109 & 1U) == 0) {
        local_218 = (AffixPatternMatcher *)0x0;
      }
      else {
        local_218 = this->fAffixPatternMatchers + (int)posPrefix;
        posPrefix._0_4_ = (int)posPrefix + 1;
      }
      pAStack_168 = local_218;
      if (local_99 == '\x01') {
        posSuffix = pAStack_108;
        pAStack_98 = local_218;
LAB_003110a9:
        local_16c = (uint)(local_99 == -1);
        AffixMatcher::AffixMatcher(&local_190,pAStack_108,pAStack_168,local_16c);
        lVar3 = (long)posPrefix._4_4_;
        posPrefix._4_4_ = posPrefix._4_4_ + 1;
        AffixMatcher::operator=(this->fAffixMatchers + lVar3,&local_190);
        AffixMatcher::~AffixMatcher(&local_190);
        if ((((numAffixMatchers._3_1_ & 1) != 0) && (pAStack_108 != (AffixPatternMatcher *)0x0)) &&
           (pAStack_168 != (AffixPatternMatcher *)0x0)) {
          if ((local_99 == '\x01') ||
             (bVar1 = anon_unknown.dwarf_19932b::equals(pAStack_108,posSuffix), !bVar1)) {
            AffixMatcher::AffixMatcher(&local_1b0,pAStack_108,(AffixPatternMatcher *)0x0,local_16c);
            lVar3 = (long)posPrefix._4_4_;
            posPrefix._4_4_ = posPrefix._4_4_ + 1;
            AffixMatcher::operator=(this->fAffixMatchers + lVar3,&local_1b0);
            AffixMatcher::~AffixMatcher(&local_1b0);
          }
          if ((local_99 == '\x01') ||
             (bVar1 = anon_unknown.dwarf_19932b::equals(pAStack_168,pAStack_98), !bVar1)) {
            AffixMatcher::AffixMatcher
                      ((AffixMatcher *)&i,(AffixPatternMatcher *)0x0,pAStack_168,local_16c);
            lVar3 = (long)posPrefix._4_4_;
            posPrefix._4_4_ = posPrefix._4_4_ + 1;
            AffixMatcher::operator=(this->fAffixMatchers + lVar3,(AffixMatcher *)&i);
            AffixMatcher::~AffixMatcher((AffixMatcher *)&i);
          }
        }
      }
      else {
        bVar1 = anon_unknown.dwarf_19932b::equals(pAStack_108,posSuffix);
        if ((!bVar1) || (bVar1 = anon_unknown.dwarf_19932b::equals(pAStack_168,pAStack_98), !bVar1))
        goto LAB_003110a9;
      }
    }
    do {
      temp._31_1_ = 0;
      for (temp.fFlags = 1; temp.fFlags < posPrefix._4_4_; temp.fFlags = temp.fFlags + 1) {
        iVar2 = AffixMatcher::compareTo
                          (this->fAffixMatchers + (temp.fFlags + -1),
                           this->fAffixMatchers + temp.fFlags);
        if ('\0' < iVar2) {
          temp._31_1_ = 1;
          AffixMatcher::AffixMatcher
                    ((AffixMatcher *)local_1f8,this->fAffixMatchers + (temp.fFlags + -1));
          AffixMatcher::operator=
                    (this->fAffixMatchers + (temp.fFlags + -1),this->fAffixMatchers + temp.fFlags);
          AffixMatcher::operator=(this->fAffixMatchers + temp.fFlags,(AffixMatcher *)local_1f8);
          AffixMatcher::~AffixMatcher((AffixMatcher *)local_1f8);
        }
      }
    } while ((temp._31_1_ & 1) != 0);
    for (local_1fc = 0; local_1fc < posPrefix._4_4_; local_1fc = local_1fc + 1) {
      (*output->_vptr_MutableMatcherCollection[2])(output,this->fAffixMatchers + local_1fc);
    }
    UnicodeString::~UnicodeString((UnicodeString *)&signDisplay);
  }
  return;
}

Assistant:

void AffixMatcherWarehouse::createAffixMatchers(const AffixPatternProvider& patternInfo,
                                                MutableMatcherCollection& output,
                                                const IgnorablesMatcher& ignorables,
                                                parse_flags_t parseFlags, UErrorCode& status) {
    if (!isInteresting(patternInfo, ignorables, parseFlags, status)) {
        return;
    }

    // The affixes have interesting characters, or we are in strict mode.
    // Use initial capacity of 6, the highest possible number of AffixMatchers.
    UnicodeString sb;
    bool includeUnpaired = 0 != (parseFlags & PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES);
    UNumberSignDisplay signDisplay = (0 != (parseFlags & PARSE_FLAG_PLUS_SIGN_ALLOWED)) ? UNUM_SIGN_ALWAYS
                                                                                        : UNUM_SIGN_AUTO;

    int32_t numAffixMatchers = 0;
    int32_t numAffixPatternMatchers = 0;

    AffixPatternMatcher* posPrefix = nullptr;
    AffixPatternMatcher* posSuffix = nullptr;

    // Pre-process the affix strings to resolve LDML rules like sign display.
    for (int8_t signum = 1; signum >= -1; signum--) {
        // Generate Prefix
        bool hasPrefix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, true, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasPrefix, status);
        AffixPatternMatcher* prefix = hasPrefix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        // Generate Suffix
        bool hasSuffix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, false, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasSuffix, status);
        AffixPatternMatcher* suffix = hasSuffix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        if (signum == 1) {
            posPrefix = prefix;
            posSuffix = suffix;
        } else if (equals(prefix, posPrefix) && equals(suffix, posSuffix)) {
            // Skip adding these matchers (we already have equivalents)
            continue;
        }

        // Flags for setting in the ParsedNumber; the token matchers may add more.
        int flags = (signum == -1) ? FLAG_NEGATIVE : 0;

        // Note: it is indeed possible for posPrefix and posSuffix to both be null.
        // We still need to add that matcher for strict mode to work.
        fAffixMatchers[numAffixMatchers++] = {prefix, suffix, flags};
        if (includeUnpaired && prefix != nullptr && suffix != nullptr) {
            // The following if statements are designed to prevent adding two identical matchers.
            if (signum == 1 || !equals(prefix, posPrefix)) {
                fAffixMatchers[numAffixMatchers++] = {prefix, nullptr, flags};
            }
            if (signum == 1 || !equals(suffix, posSuffix)) {
                fAffixMatchers[numAffixMatchers++] = {nullptr, suffix, flags};
            }
        }
    }

    // Put the AffixMatchers in order, and then add them to the output.
    // Since there are at most 9 elements, do a simple-to-implement bubble sort.
    bool madeChanges;
    do {
        madeChanges = false;
        for (int32_t i = 1; i < numAffixMatchers; i++) {
            if (fAffixMatchers[i - 1].compareTo(fAffixMatchers[i]) > 0) {
                madeChanges = true;
                AffixMatcher temp = std::move(fAffixMatchers[i - 1]);
                fAffixMatchers[i - 1] = std::move(fAffixMatchers[i]);
                fAffixMatchers[i] = std::move(temp);
            }
        }
    } while (madeChanges);

    for (int32_t i = 0; i < numAffixMatchers; i++) {
        // Enable the following line to debug affixes
        //std::cout << "Adding affix matcher: " << CStr(fAffixMatchers[i].toString())() << std::endl;
        output.addMatcher(fAffixMatchers[i]);
    }
}